

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.hpp
# Opt level: O0

void __thiscall
helics::ValueFederate::publishBytes
          (ValueFederate *this,Publication *pub,char *data,size_t data_size)

{
  size_t in_RSI;
  data_view *in_stack_ffffffffffffffb0;
  data_view *in_stack_ffffffffffffffc0;
  Publication *in_stack_ffffffffffffffc8;
  ValueFederate *in_stack_ffffffffffffffd0;
  
  data_view::data_view(in_stack_ffffffffffffffb0,&stack0xffffffffffffffc0,in_RSI);
  publishBytes(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  data_view::~data_view((data_view *)0x1d1e43);
  return;
}

Assistant:

void publishBytes(const Publication& pub, const char* data, size_t data_size)
    {
        publishBytes(pub, data_view{data, data_size});
    }